

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.h
# Opt level: O3

void __thiscall sundials::Context::Context(Context *this,void *comm)

{
  _Head_base<0UL,__SUNContext_**,_false> sunctx;
  
  (this->sunctx_)._M_t.super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
  _M_t.super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>.
  super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl = (_SUNContext **)0x0;
  sunctx._M_head_impl = (_SUNContext **)operator_new(8);
  *sunctx._M_head_impl = (SUNContext)0x0;
  (this->sunctx_)._M_t.super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>.
  _M_t.super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>.
  super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl = sunctx._M_head_impl;
  SUNContext_Create(comm,sunctx._M_head_impl);
  return;
}

Assistant:

explicit Context(void* comm = NULL)
  {
    sunctx_ = std::unique_ptr<SUNContext>(new SUNContext());
    SUNContext_Create(comm, sunctx_.get());
  }